

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void __thiscall FIX::double_conversion::StringBuilder::AddCharacter(StringBuilder *this,char c)

{
  int iVar1;
  
  if (c == '\0') {
    __assert_fail("c != \'\\0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xf3,"void FIX::double_conversion::StringBuilder::AddCharacter(char)");
  }
  iVar1 = this->position_;
  if ((-1 < (long)iVar1) && (iVar1 < (this->buffer_).length_)) {
    this->position_ = iVar1 + 1;
    (this->buffer_).start_[iVar1] = c;
    return;
  }
  __assert_fail("!is_finalized() && position_ < buffer_.length()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xf4,"void FIX::double_conversion::StringBuilder::AddCharacter(char)");
}

Assistant:

void AddCharacter(char c) {
    ASSERT(c != '\0');
    ASSERT(!is_finalized() && position_ < buffer_.length());
    buffer_[position_++] = c;
  }